

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O0

void Message<unsigned_char_const&,char_const*>(MsgType type,char *pcsz_,uchar *args,char **args_1)

{
  bool bVar1;
  exception *this;
  LogHelper *pLVar2;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  char local_81;
  _Base_ptr local_80;
  undefined1 local_78;
  undefined4 local_6c;
  _Self local_68;
  _Self local_60 [3];
  undefined1 local_48 [8];
  string msg;
  char **args_local_1;
  uchar *args_local;
  char *pcsz__local;
  MsgType type_local;
  
  msg.field_2._8_8_ = args_1;
  util::fmt_abi_cxx11_((string *)local_48,pcsz_,(ulong)*args,*args_1);
  if (type == msgError) {
    this = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<std::__cxx11::string&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    __cxa_throw(this,&util::exception::typeinfo,util::exception::~exception);
  }
  if (type != msgStatus) {
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&seen_messages_abi_cxx11_,(key_type *)local_48);
    local_68._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&seen_messages_abi_cxx11_);
    bVar1 = std::operator!=(local_60,&local_68);
    if (bVar1) {
      local_6c = 1;
      goto LAB_00209532;
    }
    pVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&seen_messages_abi_cxx11_,(value_type *)local_48);
    local_80 = (_Base_ptr)pVar3.first._M_node;
    local_78 = pVar3.second;
  }
  switch(type) {
  case msgStatus:
    break;
  case msgInfo:
    util::operator<<((LogHelper *)&util::cout,(char (*) [7])"Info: ");
    break;
  case msgFix:
    pLVar2 = util::operator<<((LogHelper *)&util::cout,GREEN);
    util::operator<<(pLVar2,(char (*) [8])"Fixed: ");
    break;
  case msgWarning:
    pLVar2 = util::operator<<((LogHelper *)&util::cout,YELLOW);
    util::operator<<(pLVar2,(char (*) [10])"Warning: ");
    break;
  case msgError:
    pLVar2 = util::operator<<((LogHelper *)&util::cout,RED);
    util::operator<<(pLVar2,(char (*) [8])"Error: ");
  }
  if (type == msgStatus) {
    pLVar2 = util::operator<<((LogHelper *)&util::cout,statusbegin);
    pLVar2 = util::operator<<(pLVar2,(char (*) [2])0x2a8cf7);
    pLVar2 = util::operator<<(pLVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_48);
    util::operator<<(pLVar2,statusend);
  }
  else {
    pLVar2 = util::operator<<((LogHelper *)&util::cout,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48);
    pLVar2 = util::operator<<(pLVar2,none);
    local_81 = '\n';
    util::operator<<(pLVar2,&local_81);
  }
  local_6c = 0;
LAB_00209532:
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Message(MsgType type, const char* pcsz_, Args&& ...args)
{
    std::string msg = util::fmt(pcsz_, std::forward<Args>(args)...);

    if (type == msgError)
        throw util::exception(msg);

    if (type != msgStatus)
    {
        if (seen_messages.find(msg) != seen_messages.end())
            return;

        seen_messages.insert(msg);
    }

    switch (type)
    {
    case msgStatus:  break;
    case msgInfo:    util::cout << "Info: "; break;
    case msgFix:     util::cout << colour::GREEN << "Fixed: "; break;
    case msgWarning: util::cout << colour::YELLOW << "Warning: "; break;
    case msgError:   util::cout << colour::RED << "Error: "; break;
    }

    if (type == msgStatus)
        util::cout << ttycmd::statusbegin << "\r" << msg << ttycmd::statusend;
    else
        util::cout << msg << colour::none << '\n';
}